

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b0a42::t_debugger::f_set_break_point
          (t_debugger *this,wstring_view a_path,size_t a_line)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  bool bVar1;
  t_debug_script *this_00;
  pointer ppVar2;
  byte local_f1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_c8;
  const_iterator local_90;
  _Base_ptr local_88;
  __sv_type local_80;
  t_debugger *local_70;
  wchar_t *local_68;
  _Self local_60;
  _Self local_58;
  iterator i;
  t_debug_script *debug;
  size_t a_line_local;
  t_debugger *this_local;
  wstring_view a_path_local;
  
  a_path_local._M_len = (size_t)a_path._M_str;
  this_local = (t_debugger *)a_path._M_len;
  debug = (t_debug_script *)a_line;
  a_line_local = (size_t)this;
  this_00 = f_find_module(this,a_path);
  if (this_00 != (t_debug_script *)0x0) {
    _i = xemmai::t_debug_script::f_set_break_point(this_00,(size_t)debug,0);
    debug = (t_debug_script *)i._M_node;
    if (i._M_node == (_Base_ptr)0x0) {
      return;
    }
  }
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::wstring,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
       ::lower_bound<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                 ((map<std::__cxx11::wstring,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
                   *)&this->v_break_points,
                  (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::end(&this->v_break_points);
  bVar1 = std::operator==(&local_58,&local_60);
  local_f1 = 1;
  if (!bVar1) {
    local_70 = this_local;
    local_68 = (wchar_t *)a_path_local._M_len;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ::operator->(&local_58);
    local_80 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)ppVar2);
    __x._M_str = local_68;
    __x._M_len = (size_t)local_70;
    bVar1 = std::operator==(__x,local_80);
    local_f1 = bVar1 ^ 0xff;
  }
  if ((local_f1 & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::_Rb_tree_const_iterator(&local_90,&local_58);
    local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_c8._M_t._M_impl._0_8_ = 0;
    local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              (&local_c8);
    local_88 = (_Base_ptr)
               std::
               map<std::__cxx11::wstring,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
               ::
               emplace_hint<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                         ((map<std::__cxx11::wstring,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
                           *)&this->v_break_points,local_90,
                          (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local,
                          &local_c8);
    local_58._M_node = local_88;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              (&local_c8);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ::operator->(&local_58);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
            (&ppVar2->second,(value_type_conflict2 *)&debug);
  return;
}

Assistant:

void f_set_break_point(std::wstring_view a_path, size_t a_line)
	{
		auto debug = f_find_module(a_path);
		if (debug) {
			a_line = debug->f_set_break_point(a_line).first;
			if (a_line <= 0) return;
		}
		auto i = v_break_points.lower_bound(a_path);
		if (i == v_break_points.end() || i->first != a_path) i = v_break_points.emplace_hint(i, a_path, std::set<size_t>());
		i->second.insert(a_line);
	}